

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int nk_list_view_begin(nk_context *ctx,nk_list_view *view,char *title,nk_flags flags,int row_height,
                      int row_count)

{
  nk_window *win;
  nk_panel *pnVar1;
  long lVar2;
  nk_hash name;
  int iVar3;
  nk_table *iter;
  nk_table *pnVar4;
  nk_uint *y_offset;
  nk_uint value;
  nk_table *pnVar5;
  ulong uVar6;
  int iVar7;
  nk_uint *extraout_RDX;
  undefined7 uVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  nk_uint *unaff_R15;
  bool bVar14;
  float fVar15;
  float fVar16;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x49ff,
                  "int nk_list_view_begin(struct nk_context *, struct nk_list_view *, const char *, nk_flags, int, int)"
                 );
  }
  if (view == (nk_list_view *)0x0) {
    __assert_fail("view",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x4a00,
                  "int nk_list_view_begin(struct nk_context *, struct nk_list_view *, const char *, nk_flags, int, int)"
                 );
  }
  if (title == (char *)0x0) {
    __assert_fail("title",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x4a01,
                  "int nk_list_view_begin(struct nk_context *, struct nk_list_view *, const char *, nk_flags, int, int)"
                 );
  }
  iVar7 = (int)(ctx->style).window.spacing.y;
  win = ctx->current;
  lVar11 = 0;
  if (iVar7 < 1) {
    iVar7 = 0;
  }
  if (*title != '\0') {
    lVar11 = 0;
    do {
      lVar2 = lVar11 + 1;
      lVar11 = lVar11 + 1;
    } while (title[lVar2] != '\0');
  }
  name = nk_murmur_hash(title,(int)lVar11,2);
  pnVar4 = win->tables;
  pnVar5 = pnVar4;
  y_offset = extraout_RDX;
  do {
    if (pnVar5 == (nk_table *)0x0) {
      unaff_R15 = (nk_uint *)0x0;
      break;
    }
    uVar12 = (ulong)pnVar5->size;
    uVar8 = (undefined7)((ulong)y_offset >> 8);
    y_offset = (nk_uint *)CONCAT71(uVar8,uVar12 != 0);
    if (uVar12 == 0) {
LAB_0011de77:
      pnVar5 = pnVar5->next;
    }
    else {
      if (pnVar5->keys[0] == name) {
        y_offset = (nk_uint *)CONCAT71(uVar8,1);
        uVar13 = 0;
      }
      else {
        uVar6 = 0;
        do {
          if (uVar12 - 1 == uVar6) {
            y_offset = (nk_uint *)CONCAT71((int7)(uVar6 + 1 >> 8),uVar6 + 1 < uVar12);
            goto LAB_0011de77;
          }
          uVar13 = uVar6 + 1;
          lVar11 = uVar6 + 1;
          uVar6 = uVar13;
        } while (pnVar5->keys[lVar11] != name);
        y_offset = (nk_uint *)CONCAT71((int7)(uVar13 >> 8),uVar13 < uVar12);
      }
      pnVar5->seq = win->seq;
      unaff_R15 = pnVar5->values + uVar13;
    }
  } while ((char)y_offset == '\0');
  value = (nk_uint)pnVar5;
  if (unaff_R15 == (nk_uint *)0x0) {
    unaff_R15 = nk_add_value(ctx,win,name,value);
    y_offset = nk_add_value(ctx,win,name + 1,value);
    *y_offset = 0;
    *unaff_R15 = 0;
  }
  else {
    do {
      uVar12 = (ulong)pnVar4->size;
      bVar14 = uVar12 != 0;
      if (uVar12 == 0) {
LAB_0011dede:
        pnVar4 = pnVar4->next;
      }
      else {
        if (pnVar4->keys[0] == name + 1) {
          bVar14 = true;
          uVar13 = 0;
        }
        else {
          uVar6 = 0;
          do {
            if (uVar12 - 1 == uVar6) {
              bVar14 = uVar6 + 1 < uVar12;
              goto LAB_0011dede;
            }
            uVar13 = uVar6 + 1;
            lVar11 = uVar6 + 1;
            uVar6 = uVar13;
          } while (pnVar4->keys[lVar11] != name + 1);
          bVar14 = uVar13 < uVar12;
        }
        pnVar4->seq = win->seq;
        y_offset = pnVar4->values + uVar13;
      }
    } while (!bVar14);
  }
  view->scroll_value = *y_offset;
  view->scroll_pointer = y_offset;
  *y_offset = 0;
  iVar3 = nk_group_scrolled_offset_begin(ctx,unaff_R15,y_offset,title,flags);
  pnVar1 = ctx->current->layout;
  iVar10 = 1;
  if (1 < row_count) {
    iVar10 = row_count;
  }
  view->total_height = iVar10 * (iVar7 + row_height);
  fVar16 = (float)(iVar7 + row_height);
  fVar15 = (float)view->scroll_value / fVar16;
  iVar7 = (int)(float)(~-(uint)(fVar15 <= 0.0) & (uint)fVar15);
  view->begin = iVar7;
  fVar16 = (pnVar1->clip).h / fVar16;
  if ((int)((uint)((float)(int)fVar16 < fVar16) + (int)fVar16) < 0) {
    iVar10 = 0;
  }
  else {
    iVar10 = (uint)((float)(int)fVar16 < fVar16) + (int)fVar16;
  }
  iVar9 = row_count - iVar7;
  if (iVar10 < row_count - iVar7) {
    iVar9 = iVar10;
  }
  view->count = iVar9;
  view->end = iVar9 + iVar7;
  view->ctx = ctx;
  return iVar3;
}

Assistant:

NK_API int
nk_list_view_begin(struct nk_context *ctx, struct nk_list_view *view,
    const char *title, nk_flags flags, int row_height, int row_count)
{
    int title_len;
    nk_hash title_hash;
    nk_uint *x_offset;
    nk_uint *y_offset;

    int result;
    struct nk_window *win;
    struct nk_panel *layout;
    const struct nk_style *style;
    struct nk_vec2 item_spacing;

    NK_ASSERT(ctx);
    NK_ASSERT(view);
    NK_ASSERT(title);
    if (!ctx || !view || !title) return 0;

    win = ctx->current;
    style = &ctx->style;
    item_spacing = style->window.spacing;
    row_height += NK_MAX(0, (int)item_spacing.y);

    /* find persistent list view scrollbar offset */
    title_len = (int)nk_strlen(title);
    title_hash = nk_murmur_hash(title, (int)title_len, NK_PANEL_GROUP);
    x_offset = nk_find_value(win, title_hash);
    if (!x_offset) {
        x_offset = nk_add_value(ctx, win, title_hash, 0);
        y_offset = nk_add_value(ctx, win, title_hash+1, 0);

        NK_ASSERT(x_offset);
        NK_ASSERT(y_offset);
        if (!x_offset || !y_offset) return 0;
        *x_offset = *y_offset = 0;
    } else y_offset = nk_find_value(win, title_hash+1);
    view->scroll_value = *y_offset;
    view->scroll_pointer = y_offset;

    *y_offset = 0;
    result = nk_group_scrolled_offset_begin(ctx, x_offset, y_offset, title, flags);
    win = ctx->current;
    layout = win->layout;

    view->total_height = row_height * NK_MAX(row_count,1);
    view->begin = (int)NK_MAX(((float)view->scroll_value / (float)row_height), 0.0f);
    view->count = (int)NK_MAX(nk_iceilf((layout->clip.h)/(float)row_height),0);
    view->count = NK_MIN(view->count, row_count - view->begin);
    view->end = view->begin + view->count;
    view->ctx = ctx;
    return result;
}